

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  parasail_result_t *ppVar6;
  longlong lVar7;
  __m128i *palVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  __m128i *ptr;
  int64_t *ptr_00;
  int64_t iVar12;
  uint uVar13;
  int iVar14;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  size_t size;
  parasail_result_t *extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  ulong extraout_XMM0_Qa_06;
  ulong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  ulong uVar15;
  ulong extraout_XMM0_Qb_05;
  ulong extraout_XMM0_Qb_06;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i alVar16;
  ulong local_518;
  ulong local_510;
  ulong local_508;
  int local_4fc;
  long local_4f8;
  long local_4f0;
  int local_4e4;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int64_t *t;
  __m128i vCompare;
  int64_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_64_t e;
  __m128i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  long local_3b0;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int64_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_64","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_64",
            "profile->profile64.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_64",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_sse2_128_64",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_striped_profile_sse2_128_64","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_striped_profile_sse2_128_64","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_sse2_128_64","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_striped_profile_sse2_128_64","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len - 1;
    ppVar2 = profile->matrix;
    iVar9 = (iVar1 + 1) / 2;
    iVar14 = (iVar1 + -1) % iVar9;
    alVar16[0] = (long)(iVar1 + -1) % (long)iVar9 & 0xffffffff;
    iVar10 = ~((iVar1 + -1) / iVar9) + 2;
    if (-open < ppVar2->min) {
      local_3b0 = (long)open;
    }
    else {
      local_3b0 = -(long)ppVar2->min;
    }
    local_3b0 = local_3b0 + -0x7fffffffffffffff;
    alVar16[1] = (long)ppVar2->max;
    a[1]._0_4_ = iVar9;
    a[0] = (longlong)profile;
    a[1]._4_4_ = 0;
    vPosMask[1] = local_3b0;
    _mm_cmpeq_epi64_rpl(a,alVar16);
    result = extraout_XMM0_Qa;
    vPosMask[0] = extraout_XMM0_Qb;
    _segNum = (parasail_profile_t *)parasail_result_new();
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x2800802;
      uVar13 = 0;
      if (s1_beg != 0) {
        uVar13 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar13 | *(uint *)&_segNum->field_0xc;
      uVar13 = 0;
      if (s1_end != 0) {
        uVar13 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar13 | *(uint *)&_segNum->field_0xc;
      uVar13 = 0;
      if (s2_beg != 0) {
        uVar13 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar13 | *(uint *)&_segNum->field_0xc;
      uVar13 = 0;
      if (s2_end != 0) {
        uVar13 = 0x8000;
      }
      uVar13 = uVar13 | *(uint *)&_segNum->field_0xc;
      b_11[1] = (ulong)uVar13;
      *(uint *)&_segNum->field_0xc = uVar13;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar9);
      pvE = parasail_memalign___m128i(0x10,(long)iVar9);
      ptr = parasail_memalign___m128i(0x10,(long)iVar9);
      size = (size_t)(s2Len + 1);
      local_518 = 0x10;
      ptr_00 = parasail_memalign_int64_t(0x10,size);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        local_508 = extraout_RDX;
        for (k = 0; k < iVar9; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 2; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              uVar13 = h.m[1]._0_4_ * iVar9 + k;
              local_508 = (ulong)uVar13;
              local_4e4 = -(gap * uVar13) - open;
            }
            else {
              local_4e4 = 0;
            }
            local_4f8 = (long)local_4e4;
            local_4f0 = local_4f8;
            if (local_4f8 < -0x8000000000000000) {
              local_4f0 = -0x8000000000000000;
            }
            *(long *)((long)&e + (long)(int)h.m[1]._0_4_ * 8 + 8) = local_4f0;
            local_4f8 = local_4f8 - open;
            if (local_4f8 < -0x8000000000000000) {
              local_4f8 = -0x8000000000000000;
            }
            (&tmp)[(int)h.m[1]._0_4_] = local_4f8;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          b_11[1] = (long)(int)h.m[1]._4_4_ * 0x10;
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_4fc = -(gap * (k + -1)) - open;
          }
          else {
            local_4fc = 0;
          }
          local_508 = (ulong)local_4fc;
          if ((long)local_508 < -0x8000000000000000) {
            local_508 = 0x8000000000000000;
          }
          b_11[1] = (ulong)k;
          ptr_00[b_11[1]] = local_508;
        }
        for (s1Len = 0; palVar8 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          pvE = pvHLoad;
          pvHLoad = palVar8;
          b_08[1] = (long)s1Len;
          local_518 = ptr_00[b_08[1]];
          size = 0;
          a_00[1] = 0;
          a_00[0] = local_518;
          alVar16 = _mm_insert_epi64_rpl(a_00,(ulong)(byte)s2[s1Len],s1Len);
          iVar12 = alVar16[1];
          for (k = 0; k < iVar9; k = k + 1) {
            b[1] = (long)k * 0x10;
            a_01[1] = size;
            a_01[0] = local_518;
            b[0] = iVar12;
            alVar16 = _mm_max_epi64_rpl(a_01,b);
            b_00[0] = alVar16[1];
            a_02[1] = size;
            a_02[0] = local_518;
            b_00[1] = b[1];
            alVar16 = _mm_max_epi64_rpl(a_02,b_00);
            b_01[0] = alVar16[1];
            b_01[1] = (long)k * 0x10;
            palVar8[k][0] = extraout_XMM0_Qa_00;
            palVar8[k][1] = extraout_XMM0_Qb_00;
            a_03[1] = size;
            a_03[0] = local_518;
            alVar16 = _mm_max_epi64_rpl(a_03,b_01);
            b_02[0] = alVar16[1];
            a_04[1] = size;
            a_04[0] = local_518;
            b_02[1] = b_01[1];
            alVar16 = _mm_min_epi64_rpl(a_04,b_02);
            b_03[0] = alVar16[1];
            a_05[1] = size;
            a_05[0] = local_518;
            b_03[1] = b_01[1];
            alVar16 = _mm_min_epi64_rpl(a_05,b_03);
            b_04[0] = alVar16[1];
            a_06[1] = size;
            a_06[0] = local_518;
            b_04[1] = b_01[1];
            alVar16 = _mm_min_epi64_rpl(a_06,b_04);
            b_05[0] = alVar16[1];
            a_07[1] = size;
            a_07[0] = local_518;
            b_05[1] = b_01[1];
            alVar16 = _mm_max_epi64_rpl(a_07,b_05);
            b_06[0] = alVar16[1];
            b_06[1] = (long)k * 0x10;
            ptr[k][0] = extraout_XMM0_Qa_01;
            ptr[k][1] = extraout_XMM0_Qb_01;
            a_08[1] = size;
            a_08[0] = local_518;
            alVar16 = _mm_max_epi64_rpl(a_08,b_06);
            iVar12 = alVar16[1];
            b_08[1] = (long)k * 0x10;
          }
          for (end_query = 0; end_query < 2; end_query = end_query + 1) {
            if (s2_beg == 0) {
              b_08[1] = (long)open;
              local_510 = ptr_00[s1Len + 1] - b_08[1];
            }
            else {
              local_510 = (ulong)-open;
            }
            if ((long)local_510 < -0x8000000000000000) {
              local_518 = 0x8000000000000000;
            }
            else {
              local_518 = local_510;
            }
            size = 0;
            a_09[1] = 0;
            a_09[0] = local_518;
            alVar16 = _mm_insert_epi64_rpl(a_09,iVar12,(int)b_08[1]);
            iVar12 = alVar16[1];
            for (k = 0; k < iVar9; k = k + 1) {
              b_07[1] = (long)k * 0x10;
              a_10[1] = size;
              a_10[0] = local_518;
              b_07[0] = iVar12;
              alVar16 = _mm_max_epi64_rpl(a_10,b_07);
              b_08[0] = alVar16[1];
              b_08[1] = (long)k * 0x10;
              palVar8[k][0] = extraout_XMM0_Qa_02;
              palVar8[k][1] = extraout_XMM0_Qb_02;
              a_11[1] = size;
              a_11[0] = local_518;
              alVar16 = _mm_min_epi64_rpl(a_11,b_08);
              b_09[0] = alVar16[1];
              a_12[1] = size;
              a_12[0] = local_518;
              b_09[1] = b_08[1];
              alVar16 = _mm_max_epi64_rpl(a_12,b_09);
              b_10[0] = alVar16[1];
              a_13[1] = size;
              a_13[0] = local_518;
              b_10[1] = b_08[1];
              alVar16 = _mm_cmpgt_epi64_rpl(a_13,b_10);
              iVar12 = alVar16[1];
              auVar5._8_8_ = extraout_XMM0_Qb_03;
              auVar5._0_8_ = extraout_XMM0_Qa_03;
              if ((((((((((((((((auVar5 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar5 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar5 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar5 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar5 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar5 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (extraout_XMM0_Qb_03 >> 7 & 1) == 0) &&
                       (extraout_XMM0_Qb_03 >> 0xf & 1) == 0) &&
                      (extraout_XMM0_Qb_03 >> 0x17 & 1) == 0) &&
                     (extraout_XMM0_Qb_03 >> 0x1f & 1) == 0) &&
                    (extraout_XMM0_Qb_03 >> 0x27 & 1) == 0) &&
                   (extraout_XMM0_Qb_03 >> 0x2f & 1) == 0) && (extraout_XMM0_Qb_03 >> 0x37 & 1) == 0
                  ) && -1 < (long)extraout_XMM0_Qb_03) goto LAB_005e68c6;
            }
          }
LAB_005e68c6:
          lVar7 = vPosMask[0];
          ppVar6 = result;
          b_11[1] = (long)iVar14 * 0x10;
          a_14[1] = size;
          a_14[0] = local_518;
          b_11[0] = iVar12;
          alVar16 = _mm_cmpgt_epi64_rpl(a_14,b_11);
          b_12[0] = alVar16[1];
          uVar15 = lVar7 & extraout_XMM0_Qb_04;
          a_15[1] = size;
          a_15[0] = local_518;
          b_12[1] = b_11[1];
          alVar16 = _mm_max_epi64_rpl(a_15,b_12);
          local_508 = alVar16[1];
          auVar4._8_8_ = uVar15;
          auVar4._0_8_ = (ulong)ppVar6 & extraout_XMM0_Qa_04;
          if ((((((((((((((((auVar4 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar4 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar4 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar4 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar4 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar4 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar15 >> 7 & 1) != 0) || (uVar15 >> 0xf & 1) != 0) ||
                  (uVar15 >> 0x17 & 1) != 0) || (uVar15 >> 0x1f & 1) != 0) ||
                (uVar15 >> 0x27 & 1) != 0) || (uVar15 >> 0x2f & 1) != 0) ||
              (uVar15 >> 0x37 & 1) != 0) || (long)uVar15 < 0) {
            matrix._0_4_ = s1Len;
          }
          vPosMask[1] = extraout_XMM0_Qa_05;
        }
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar10; end_query = end_query + 1) {
            vPosMask[1] = 0;
          }
          a_16[1] = size;
          a_16[0] = 1;
          local_518 = 1;
          local_3b0 = _mm_extract_epi64_rpl(a_16,(int)local_508);
          local_508 = extraout_RDX_00;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          _temp = *pvHLoad;
          for (k = 0; k < iVar9 * 2; k = k + 1) {
            uVar13 = (k % 2) * iVar9;
            local_508 = (ulong)uVar13;
            iVar11 = k / 2 + uVar13;
            if (iVar11 < iVar1) {
              if (local_3b0 < *_temp) {
                local_3b0 = *_temp;
                matrix._0_4_ = s2Len - 1;
                matrix._4_4_ = iVar11;
              }
              else if (((*_temp == local_3b0) &&
                       (b_11[1] = (ulong)(s2Len - 1U), (uint)matrix == s2Len - 1U)) &&
                      (iVar11 < matrix._4_4_)) {
                matrix._4_4_ = iVar11;
              }
            }
            _temp = _temp + 1;
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          b_11[1] = (long)iVar14 * 0x10;
          for (end_query = 0; end_query < iVar10; end_query = end_query + 1) {
          }
          a_17[1] = size;
          a_17[0] = 1;
          local_518 = 1;
          iVar12 = _mm_extract_epi64_rpl(a_17,(int)local_508);
          local_3b0._0_4_ = (int)iVar12;
          matrix._0_4_ = s2Len - 1;
          matrix._4_4_ = iVar1 + -1;
          local_508 = extraout_RDX_01;
        }
        a_18[1] = size;
        a_18[0] = local_518;
        b_13[1] = b_11[1];
        b_13[0] = local_508;
        alVar16 = _mm_cmplt_epi64_rpl(a_18,b_13);
        b_14[0] = alVar16[1];
        a_19[1] = size;
        a_19[0] = local_518;
        b_14[1] = b_11[1];
        _mm_cmpgt_epi64_rpl(a_19,b_14);
        b_11[1] = extraout_XMM0_Qb_05 | extraout_XMM0_Qb_06;
        auVar3._8_8_ = b_11[1];
        auVar3._0_8_ = extraout_XMM0_Qa_06 | extraout_XMM0_Qa_07;
        if ((((((((((((((((auVar3 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar3 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar3 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar3 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar3 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar3 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar3 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar3 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (b_11[1] >> 7 & 1) != 0) || (b_11[1] >> 0xf & 1) != 0) ||
                (b_11[1] >> 0x17 & 1) != 0) || (b_11[1] >> 0x1f & 1) != 0) ||
              (b_11[1] >> 0x27 & 1) != 0) || (b_11[1] >> 0x2f & 1) != 0) ||
            (b_11[1] >> 0x37 & 1) != 0) || (long)b_11[1] < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_3b0._0_4_ = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_3b0;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (uint)matrix;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64_rpl(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}